

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O3

void __thiscall
fire::_matcher::_matcher
          (_matcher *this,int argc,char **argv,int main_argc,bool space_assignment,bool strict)

{
  ostream *poVar1;
  long *plVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  identifier help;
  allocator_type local_1a9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  _first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  undefined1 local_180 [32];
  undefined1 *local_160;
  undefined1 local_150 [16];
  long *local_140 [2];
  long local_130 [2];
  undefined1 local_120 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_108;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_1a8 = &(this->_executable).field_2;
  (this->_executable)._M_dataplus._M_p = (pointer)local_1a8;
  (this->_executable)._M_string_length = 0;
  (this->_executable).field_2._M_local_buf[0] = '\0';
  local_1a0 = &this->_deferred_error;
  (this->_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_positional).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_named).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_named).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_named).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_queried).super__Vector_base<fire::identifier,_std::allocator<fire::identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_queried).super__Vector_base<fire::identifier,_std::allocator<fire::identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_queried).super__Vector_base<fire::identifier,_std::allocator<fire::identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aStack_108._8_8_ = 0;
  local_120._16_8_ = 0;
  aStack_108._0_8_ = 0;
  local_120._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_120._0_8_ = (long)local_120 + 0x10;
  identifier::identifier
            (&local_1a0->_order,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_120);
  if (local_120._0_8_ != (long)local_120 + 0x10) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  (this->_deferred_error)._value._M_dataplus._M_p = (pointer)&(this->_deferred_error)._value.field_2
  ;
  (this->_deferred_error)._value._M_string_length = 0;
  (this->_deferred_error)._value.field_2._M_local_buf[0] = '\0';
  (this->_deferred_error)._empty = true;
  *(undefined4 *)((long)&this->_main_argc + 3) = 0;
  this->_main_argc = 0;
  this->_main_argc = main_argc;
  this->_space_assignment = space_assignment;
  this->_strict = strict;
  parse(this,argc,argv);
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"-h","");
  local_160 = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"--help","");
  plVar2 = local_130;
  local_140[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"Print the help message","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_180;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_198,__l,&local_1a9);
  identifier::identifier((identifier *)local_120,&local_198,(optional<int>)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  lVar3 = -0x60;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  get_and_mark_as_queried_abi_cxx11_
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fire::_matcher::arg_type>
              *)local_180,this,(identifier *)local_120);
  this->_help_flag = (arg_type)local_160 != none_t;
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if ((this->_strict == true) && (this->_main_argc < 1)) {
    if (this->_help_flag == true) {
      _help_logger::print_help((_help_logger *)_storage<void>::help_logger);
      exit(0);
    }
    check_named(this);
    check_positional(this);
    if ((this->_deferred_error)._empty == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(this->_deferred_error)._value._M_dataplus._M_p,
                          (this->_deferred_error)._value._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar1);
      exit(1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p,local_90[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._8_8_ != &aStack_108) {
    operator_delete((void *)local_120._8_8_,aStack_108._0_8_ + 1);
  }
  return;
}

Assistant:

_matcher::_matcher(int argc, const char **argv, int main_argc, bool space_assignment, bool strict) {
        _main_argc = main_argc;
        _space_assignment = space_assignment;
        _strict = strict;

        parse(argc, argv);
        identifier help({"-h", "--help", "Print the help message"}, optional<int>());
        _help_flag = get_and_mark_as_queried(help).second != arg_type::none_t;
        check(false);
    }